

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents,_Bool hpa)

{
  emitter_justify_t *peVar1;
  tsd_t *tsd;
  long lVar2;
  size_t sVar3;
  undefined1 auVar4 [8];
  int iVar5;
  tsd_t *ptVar6;
  long lVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  char *format;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  emitter_justify_t *peVar15;
  long *in_FS_OFFSET;
  bool bVar16;
  ulong uStack_340;
  undefined1 local_338 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_328 [4];
  undefined4 local_308;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_300;
  undefined4 local_2e0;
  ulong local_2d8 [4];
  undefined4 local_2b8;
  ulong local_2b0;
  undefined4 local_290;
  ulong local_288 [4];
  undefined4 local_268;
  ulong local_260;
  undefined4 local_240;
  ulong local_238 [4];
  undefined4 local_218;
  ulong local_210;
  undefined4 local_1f0;
  ulong local_1e8 [4];
  undefined4 local_1c8;
  ulong local_1c0;
  undefined4 local_1a0;
  undefined1 local_198 [24];
  undefined1 local_180 [8];
  emitter_col_t name;
  emitter_col_t col32 [1];
  size_t local_128;
  size_t stats_mutexes_mib [7];
  size_t mapped;
  size_t retained;
  size_t zero_reallocs;
  uint64_t uptime;
  undefined8 local_c8;
  size_t allocated;
  size_t active;
  size_t metadata;
  size_t metadata_edata;
  size_t metadata_rtree;
  size_t metadata_thp;
  size_t resident;
  size_t num_background_threads;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  emitter_row_t row;
  size_t local_40;
  size_t sz_13;
  size_t miblen;
  
  puVar9 = local_338;
  puVar8 = local_338;
  puVar10 = local_338;
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd735;
  iVar5 = duckdb_je_mallctl("stats.allocated",&local_c8,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.allocated";
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd763;
  iVar5 = duckdb_je_mallctl("stats.active",&allocated,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.active";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd791;
  iVar5 = duckdb_je_mallctl("stats.metadata",&active,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.metadata";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd7bf;
  iVar5 = duckdb_je_mallctl("stats.metadata_edata",&metadata,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.metadata_edata";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd7ed;
  iVar5 = duckdb_je_mallctl("stats.metadata_rtree",&metadata_edata,(size_t *)local_338,(void *)0x0,0
                           );
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.metadata_rtree";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd81b;
  iVar5 = duckdb_je_mallctl("stats.metadata_thp",&metadata_rtree,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.metadata_thp";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd849;
  iVar5 = duckdb_je_mallctl("stats.resident",&metadata_thp,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.resident";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd877;
  iVar5 = duckdb_je_mallctl("stats.mapped",stats_mutexes_mib + 6,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.mapped";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd8a5;
  iVar5 = duckdb_je_mallctl("stats.retained",&mapped,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.retained";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd8d3;
  iVar5 = duckdb_je_mallctl("stats.zero_reallocs",&retained,(size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.zero_reallocs";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd901;
  iVar5 = duckdb_je_mallctl("stats.background_thread.num_threads",&resident,(size_t *)local_338,
                            (void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.background_thread.num_threads";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd92c;
  iVar5 = duckdb_je_mallctl("stats.background_thread.num_runs",&num_background_threads,
                            (size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.background_thread.num_runs";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1fd95b;
  iVar5 = duckdb_je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                            (size_t *)local_338,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar14 = "stats.background_thread.run_interval";
    puVar10 = local_338;
    goto LAB_001fe9f4;
  }
  uStack_340 = 0x1fd972;
  emitter_json_object_kv_begin(emitter,"stats");
  uStack_340 = 0x1fd98f;
  emitter_json_kv(emitter,"allocated",emitter_type_size,&local_c8);
  uStack_340 = 0x1fd9a8;
  emitter_json_kv(emitter,"active",emitter_type_size,&allocated);
  uStack_340 = 0x1fd9c1;
  emitter_json_kv(emitter,"metadata",emitter_type_size,&active);
  uStack_340 = 0x1fd9da;
  emitter_json_kv(emitter,"metadata_edata",emitter_type_size,&metadata);
  uStack_340 = 0x1fd9f3;
  emitter_json_kv(emitter,"metadata_rtree",emitter_type_size,&metadata_edata);
  uStack_340 = 0x1fda0c;
  emitter_json_kv(emitter,"metadata_thp",emitter_type_size,&metadata_rtree);
  uStack_340 = 0x1fda25;
  emitter_json_kv(emitter,"resident",emitter_type_size,&metadata_thp);
  uStack_340 = 0x1fda41;
  emitter_json_kv(emitter,"mapped",emitter_type_size,stats_mutexes_mib + 6);
  uStack_340 = 0x1fda5d;
  emitter_json_kv(emitter,"retained",emitter_type_size,&mapped);
  uStack_340 = 0x1fda79;
  emitter_json_kv(emitter,"zero_reallocs",emitter_type_size,&retained);
  emitter_table_printf
            (emitter,
             "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, mapped: %zu, retained: %zu\n"
             ,local_c8,allocated,active,metadata_rtree,metadata,metadata_edata,metadata_thp);
  uStack_340 = 0x1fdaf4;
  emitter_table_printf(emitter,"Count of realloc(non-null-ptr, 0) calls: %zu\n",retained);
  uStack_340 = 0x1fdb03;
  emitter_json_object_kv_begin(emitter,"background_thread");
  uStack_340 = 0x1fdb1c;
  emitter_json_kv(emitter,"num_threads",emitter_type_size,&resident);
  uStack_340 = 0x1fdb36;
  emitter_json_kv(emitter,"num_runs",emitter_type_uint64,&num_background_threads);
  uStack_340 = 0x1fdb4c;
  emitter_json_kv(emitter,"run_interval",emitter_type_uint64,&background_thread_num_runs);
  if (emitter->output < emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
    if (emitter->output != emitter_output_json_compact) {
      uStack_340 = 0x1fdb74;
      emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
      pcVar14 = anon_var_dwarf_647c64c + 7;
      if (emitter->output != emitter_output_json) {
        pcVar14 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar5 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        do {
          uStack_340 = 0x1fdbba;
          emitter_printf(emitter,"%s",pcVar14);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    uStack_340 = 0x1fdbd0;
    emitter_printf(emitter,"}");
  }
  uStack_340 = 0x1fdbf0;
  emitter_table_printf
            (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",resident);
  if (mutex) {
    background_thread_run_interval = 0;
    uStack_340 = 0x1fdc23;
    mutex_stats_init_cols
              ((emitter_row_t *)&background_thread_run_interval,anon_var_dwarf_647c332 + 9,
               (emitter_col_t *)local_180,(emitter_col_t *)local_338,
               (emitter_col_t *)&name.link.qre_prev);
    peVar15 = (emitter_justify_t *)background_thread_run_interval;
    if (emitter->output == emitter_output_table) {
      while (peVar15 != (emitter_justify_t *)0x0) {
        uStack_340 = 0x1fdc48;
        emitter_print_value(emitter,*peVar15,peVar15[1],peVar15[2],peVar15 + 4);
        peVar1 = peVar15 + 6;
        peVar15 = *(emitter_justify_t **)peVar1;
        if (*(emitter_justify_t **)peVar1 == (emitter_justify_t *)background_thread_run_interval) {
          peVar15 = (emitter_justify_t *)0x0;
        }
      }
      uStack_340 = 0x1fdc68;
      emitter_table_printf(emitter,anon_var_dwarf_647c26b + 8);
    }
    uStack_340 = 0x1fdc77;
    emitter_json_object_kv_begin(emitter,"mutexes");
    sz_13 = 7;
    local_40 = 8;
    uStack_340 = 0x1fdc9d;
    iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.uptime",&local_128,&sz_13);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar14 = "stats.arenas.0.uptime";
      puVar10 = local_338;
      goto LAB_001fe9f4;
    }
    stats_mutexes_mib[1] = 0;
    uStack_340 = 0x1fdccb;
    iVar5 = duckdb_je_mallctlbymib(&local_128,sz_13,&zero_reallocs,&local_40,(void *)0x0,0);
    if (iVar5 == 0) {
      sz_13 = 7;
      lVar2 = *in_FS_OFFSET;
      tsd = (tsd_t *)(lVar2 + -0x2a90);
      ptVar6 = tsd;
      if (*(char *)(lVar2 + -0x2758) != '\0') {
        uStack_340 = 0x1fe8b6;
        ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      uStack_340 = 0x1fdd17;
      iVar5 = duckdb_je_ctl_mibnametomib(ptVar6,&local_128,0,"stats.mutexes",&sz_13);
      if (iVar5 != 0) {
LAB_001fe8cf:
        pcVar14 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
        goto LAB_001fe8c5;
      }
      lVar7 = 0;
      do {
        sVar3 = zero_reallocs;
        pcVar14 = duckdb_je_global_mutex_names[lVar7];
        sz_13 = 7;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe2bf;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        uStack_340 = 0x1fdd6c;
        iVar5 = duckdb_je_ctl_mibnametomib(ptVar6,&local_128,2,pcVar14,&sz_13);
        if (iVar5 != 0) goto LAB_001fe8cf;
        sz = CONCAT44(sz._4_4_,5);
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        name._8_8_ = pcVar14;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe2d1;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"num_ops",&sz_13,local_328,&local_40,(void *)0x0,0);
        if (iVar5 != 0) {
LAB_001fe8be:
          pcVar14 = "<jemalloc>: Failure in ctl_bymibname()\n";
          puVar8 = local_338;
          goto LAB_001fe8c5;
        }
        local_308 = 5;
        if (local_328[0].uint64_val == 0 || sVar3 == 0) {
          local_300.uint64_val = 0;
        }
        else {
          local_300 = local_328[0];
          if (999999999 < sVar3) {
            local_300.uint64_val = local_328[0].uint64_val / (sVar3 / 1000000000);
          }
        }
        local_2e0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe2e3;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"num_wait",&sz_13,local_2d8,&local_40,(void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        local_2b8 = 5;
        if (local_2d8[0] == 0 || sVar3 == 0) {
          local_2b0 = 0;
        }
        else {
          local_2b0 = local_2d8[0];
          if (999999999 < sVar3) {
            local_2b0 = local_2d8[0] / (sVar3 / 1000000000);
          }
        }
        local_290 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe2f5;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"num_spin_acq",&sz_13,local_288,&local_40,(void *)0x0
                           ,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        local_268 = 5;
        if (local_288[0] == 0 || sVar3 == 0) {
          local_260 = 0;
        }
        else {
          local_260 = local_288[0];
          if (999999999 < sVar3) {
            local_260 = local_288[0] / (sVar3 / 1000000000);
          }
        }
        local_240 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe307;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"num_owner_switch",&sz_13,local_238,&local_40,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        local_218 = 5;
        if (local_238[0] == 0 || sVar3 == 0) {
          local_210 = 0;
        }
        else {
          local_210 = local_238[0];
          if (999999999 < sVar3) {
            local_210 = local_238[0] / (sVar3 / 1000000000);
          }
        }
        local_1f0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe319;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"total_wait_time",&sz_13,local_1e8,&local_40,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        local_1c8 = 5;
        if (local_1e8[0] == 0 || sVar3 == 0) {
          local_1c0 = 0;
        }
        else {
          local_1c0 = local_1e8[0];
          if (999999999 < sVar3) {
            local_1c0 = local_1e8[0] / (sVar3 / 1000000000);
          }
        }
        local_1a0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe32b;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"max_wait_time",&sz_13,local_198,&local_40,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        col32[0].justify = 4;
        sz_13 = 7;
        local_40 = 4;
        ptVar6 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          uStack_340 = 0x1fe33d;
          ptVar6 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar6,&local_128,3,"max_num_thds",&sz_13,&col32[0].type,&local_40,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8be;
        uStack_340 = 0x1fe1f1;
        emitter_json_object_kv_begin(emitter,pcVar14);
        uStack_340 = 0x1fe20b;
        mutex_stats_emit(emitter,(emitter_row_t *)&background_thread_run_interval,
                         (emitter_col_t *)local_338,(emitter_col_t *)&name.link.qre_prev);
        if (emitter->output < emitter_output_table) {
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          if (emitter->output != emitter_output_json_compact) {
            uStack_340 = 0x1fe23d;
            emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
            pcVar14 = anon_var_dwarf_647c64c + 7;
            if (emitter->output != emitter_output_json) {
              pcVar14 = " ";
            }
            if (0 < emitter->nesting_depth) {
              iVar5 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              if (iVar5 < 2) {
                iVar5 = 1;
              }
              do {
                uStack_340 = 0x1fe280;
                emitter_printf(emitter,"%s",pcVar14);
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
          }
          uStack_340 = 0x1fe296;
          emitter_printf(emitter,"}");
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
      if (emitter->output < emitter_output_table) {
        emitter->nesting_depth = emitter->nesting_depth + -1;
        emitter->item_at_depth = true;
        pcVar14 = anon_var_dwarf_647c64c + 7;
        if (emitter->output != emitter_output_json_compact) {
          uStack_340 = 0x1fe374;
          emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
          if (emitter->output != emitter_output_json) {
            pcVar14 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar5 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            if (iVar5 < 2) {
              iVar5 = 1;
            }
            do {
              uStack_340 = 0x1fe3b3;
              emitter_printf(emitter,"%s",pcVar14);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        uStack_340 = 0x1fe3c9;
        emitter_printf(emitter,"}");
      }
      goto LAB_001fe3c9;
    }
  }
  else {
LAB_001fe3c9:
    uVar12 = 1;
    if (emitter->output < emitter_output_table) {
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        uStack_340 = 0x1fe3ed;
        emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
        pcVar14 = anon_var_dwarf_647c64c + 7;
        if (emitter->output != emitter_output_json) {
          pcVar14 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar5 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          do {
            uStack_340 = 0x1fe433;
            emitter_printf(emitter,"%s",pcVar14);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      uStack_340 = 0x1fe449;
      emitter_printf(emitter,"}");
    }
    if ((!merged && !destroyed) && !unmerged) {
      return;
    }
    uStack_340 = 0x1fe469;
    emitter_json_object_kv_begin(emitter,"stats.arenas");
    local_338 = (undefined1  [8])0x4;
    uStack_340 = 0x1fe48c;
    iVar5 = duckdb_je_mallctl("arenas.narenas",&sz_13,(size_t *)local_338,(void *)0x0,0);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar14 = "arenas.narenas";
      puVar10 = local_338;
LAB_001fe9f4:
      *(undefined8 *)(puVar10 + -8) = 0x1fe9fb;
      duckdb_je_malloc_printf(format,pcVar14);
      *(code **)(puVar10 + -8) = stats_arena_print;
      abort();
    }
    local_180 = (undefined1  [8])0x3;
    lVar2 = -((sz_13 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
    puVar9 = local_338 + lVar2;
    uptime = (uint64_t)local_338;
    *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe4d4;
    iVar5 = duckdb_je_mallctlnametomib
                      ("arena.0.initialized",(size_t *)local_338,(size_t *)local_180);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar14 = "arena.0.initialized";
      puVar10 = puVar9;
      goto LAB_001fe9f4;
    }
    if ((int)sz_13 == 0) {
      bVar16 = true;
    }
    else {
      uVar12 = 0;
      uVar13 = 0;
      do {
        auVar4 = local_180;
        name.link.qre_prev = (emitter_col_t *)&DAT_00000001;
        sz = uVar12;
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe528;
        iVar5 = duckdb_je_mallctlbymib
                          ((size_t *)local_338,(size_t)auVar4,puVar9 + uVar12,
                           (size_t *)&name.link.qre_prev,(void *)0x0,0);
        if (iVar5 != 0) goto LAB_001fe8d8;
        uVar13 = uVar13 + (byte)puVar9[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < (sz_13 & 0xffffffff));
      bVar16 = uVar13 < 2;
      *(undefined8 *)((long)&uStack_340 + lVar2) = 1;
      uVar12 = *(ulong *)((long)&uStack_340 + lVar2);
    }
    auVar4 = local_180;
    sz = 0x1001;
    name.link.qre_prev = (emitter_col_t *)&DAT_00000001;
    *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe587;
    iVar5 = duckdb_je_mallctlbymib
                      ((size_t *)local_338,(size_t)auVar4,&local_40,(size_t *)&name.link.qre_prev,
                       (void *)0x0,0);
    if (iVar5 == 0) {
      row.cols.qlh_first._1_7_ = 0;
      row.cols.qlh_first._0_1_ = hpa;
      if ((merged) && ((bVar16 & unmerged) == 0)) {
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe79d;
        emitter_table_printf(emitter,"Merged arenas stats:\n");
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe7ac;
        emitter_json_object_kv_begin(emitter,"merged");
        ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar2 + -0x20))->qlh_first =
             (emitter_col_t *)row.cols.qlh_first;
        *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar2) = 0x1fe7ce;
        stats_arena_print(emitter,0x1000,bins,large,mutex,extents,
                          *(_Bool *)((long)local_328 + lVar2 + -0x20));
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe7d8;
        emitter_json_object_end(emitter);
      }
      if ((destroyed & (byte)local_40) == 1) {
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe7ee;
        emitter_table_printf(emitter,"Destroyed arenas stats:\n");
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe7fd;
        emitter_json_object_kv_begin(emitter,"destroyed");
        ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar2 + -0x20))->qlh_first =
             (emitter_col_t *)row.cols.qlh_first;
        *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar2) = 0x1fe81f;
        stats_arena_print(emitter,0x1001,bins,large,mutex,extents,
                          *(_Bool *)((long)local_328 + lVar2 + -0x20));
        if (emitter->output < emitter_output_table) {
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          if (emitter->output != emitter_output_json_compact) {
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe84b;
            emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
            pcVar14 = anon_var_dwarf_647c64c + 7;
            if (emitter->output != emitter_output_json) {
              pcVar14 = " ";
            }
            if (0 < emitter->nesting_depth) {
              uVar13 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              uVar11 = (ulong)uVar13;
              if ((int)uVar13 < 2) {
                uVar11 = uVar12 & 0xffffffff;
              }
              do {
                *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe891;
                emitter_printf(emitter,"%s",pcVar14);
                uVar13 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar13;
              } while (uVar13 != 0);
            }
          }
          *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe8a7;
          emitter_printf(emitter,"}");
        }
      }
      if ((unmerged) && ((int)sz_13 != 0)) {
        uVar11 = 0;
        do {
          if (puVar9[uVar11] == '\x01') {
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x14;
            sVar3 = *(size_t *)((long)&uStack_340 + lVar2);
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe624;
            duckdb_je_malloc_snprintf((char *)&local_128,sVar3,"%u",uVar11 & 0xffffffff);
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe62f;
            emitter_json_object_kv_begin(emitter,(char *)&local_128);
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe64a;
            emitter_table_printf(emitter,"arenas[%s]:\n",&local_128);
            ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar2 + -0x20))->qlh_first =
                 (emitter_col_t *)row.cols.qlh_first;
            *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar2) = 0x1fe66a;
            stats_arena_print(emitter,(uint)uVar11,bins,large,mutex,extents,
                              *(_Bool *)((long)local_328 + lVar2 + -0x20));
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe692;
                emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
                pcVar14 = anon_var_dwarf_647c64c + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar14 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  uVar13 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  *(undefined8 *)((long)&uStack_340 + lVar2) = 1;
                  uVar12 = (ulong)uVar13;
                  if ((int)uVar13 < 2) {
                    uVar12 = *(ulong *)((long)&uStack_340 + lVar2) & 0xffffffff;
                  }
                  do {
                    *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe6d4;
                    emitter_printf(emitter,"%s",pcVar14);
                    uVar13 = (int)uVar12 - 1;
                    uVar12 = (ulong)uVar13;
                  } while (uVar13 != 0);
                }
              }
              *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe6ea;
              emitter_printf(emitter,"}");
              *(undefined8 *)((long)&uStack_340 + lVar2) = 1;
              uVar12 = *(ulong *)((long)&uStack_340 + lVar2);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (sz_13 & 0xffffffff));
      }
      if (emitter_output_json_compact < emitter->output) {
        return;
      }
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe71e;
        emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
        pcVar14 = anon_var_dwarf_647c64c + 7;
        if (emitter->output != emitter_output_json) {
          pcVar14 = " ";
        }
        if (0 < emitter->nesting_depth) {
          uVar13 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          uVar12 = uVar12 & 0xffffffff;
          if (1 < (int)uVar13) {
            uVar12 = (ulong)uVar13;
          }
          do {
            *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe760;
            emitter_printf(emitter,"%s",pcVar14);
            uVar13 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar13;
          } while (uVar13 != 0);
        }
      }
      *(undefined8 *)((long)&uStack_340 + lVar2) = 0x1fe776;
      emitter_printf(emitter,"}");
      return;
    }
  }
LAB_001fe8d8:
  pcVar14 = "<jemalloc>: Failure in xmallctlbymib()\n";
  puVar8 = puVar9;
LAB_001fe8c5:
  *(undefined8 *)(puVar8 + -8) = 0x1fe8ca;
  duckdb_je_malloc_write(pcVar14);
  *(undefined8 *)(puVar8 + -8) = 0x1fe8cf;
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents, bool hpa) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_edata, metadata_rtree,
	    metadata_thp, resident, mapped, retained;
	size_t num_background_threads;
	size_t zero_reallocs;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_edata", &metadata_edata, size_t);
	CTL_GET("stats.metadata_rtree", &metadata_rtree, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	CTL_GET("stats.zero_reallocs", &zero_reallocs, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_edata", emitter_type_size,
	    &metadata_edata);
	emitter_json_kv(emitter, "metadata_rtree", emitter_type_size,
	    &metadata_rtree);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);
	emitter_json_kv(emitter, "zero_reallocs", emitter_type_size,
	    &zero_reallocs);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, "
	    "mapped: %zu, retained: %zu\n", allocated, active, metadata,
		metadata_thp, metadata_edata, metadata_rtree, resident, mapped,
	    retained);

	/* Strange behaviors */
	emitter_table_printf(emitter,
	    "Count of realloc(non-null-ptr, 0) calls: %zu\n", zero_reallocs);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		size_t stats_mutexes_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(stats_mutexes_mib, 0, "stats.mutexes");
		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(stats_mutexes_mib, 2,
			    global_mutex_names[i], &name, col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY_UNSAFE(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents, hpa);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}